

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

ex_ex * eval_func(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  t_float *ptVar1;
  t_ex_func *f;
  ex_ex args [10];
  int local_30;
  int i;
  int idx_local;
  ex_ex *optr_local;
  ex_ex *eptr_local;
  expr *expr_local;
  
  optr_local = eptr + 1;
  ptVar1 = (eptr->ex_cont).v_vec;
  if ((ptVar1 == (t_float *)0x0) || (*(long *)ptVar1 == 0)) {
    expr_local = (expr *)0x0;
  }
  else if (*(long *)(ptVar1 + 4) < 0xb) {
    if (*(code **)(ptVar1 + 2) == ex_if) {
      for (local_30 = 0; (long)local_30 < *(long *)(ptVar1 + 4); local_30 = local_30 + 1) {
        args[local_30].ex_cont.v_int = 0;
        args[(long)local_30 + -1].ex_end = (ex_ex *)0x0;
      }
      optr_local = ex_if(expr,optr_local,optr,(ex_ex *)&f,idx);
    }
    else {
      for (local_30 = 0; (long)local_30 < *(long *)(ptVar1 + 4); local_30 = local_30 + 1) {
        args[local_30].ex_cont.v_int = 0;
        args[(long)local_30 + -1].ex_end = (ex_ex *)0x0;
        optr_local = ex_eval(expr,optr_local,(ex_ex *)&args[(long)local_30 + -1].ex_end,idx);
      }
      (**(code **)(ptVar1 + 2))(expr,*(long *)(ptVar1 + 4),&f,optr);
    }
    for (local_30 = 0; (long)local_30 < *(long *)(ptVar1 + 4); local_30 = local_30 + 1) {
      if (args[local_30].ex_cont.v_int == 0xf) {
        free(args[(long)local_30 + -1].ex_end);
      }
    }
    expr_local = (expr *)optr_local;
  }
  else {
    pd_error(expr,"expr: eval_func: asking too many arguments\n");
    expr_local = (expr *)0x0;
  }
  return (ex_ex *)expr_local;
}

Assistant:

struct ex_ex *
eval_func(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
{
        int i;
        struct ex_ex args[MAX_ARGS];
        t_ex_func *f;

        f = (t_ex_func *)(eptr++)->ex_ptr;
        if (!f || !f->f_name) {
                return (exNULL);
        }
        if (f->f_argc > MAX_ARGS) {
                post_error((fts_object_t *) expr, "expr: eval_func: asking too many arguments\n");
                return (exNULL);
        }

                /*
                 * We treat the "if" function differently to be able to evaluate
                 * the args selectively based on the truth value of the "condition"
                 */
                if (f->f_func != (void (*)) ex_if) {
                        for (i = 0; i < f->f_argc; i++) {
                args[i].ex_type = 0;
                args[i].ex_int = 0;
                eptr = ex_eval(expr, eptr, &args[i], idx);
                        }
                (*f->f_func)(expr, f->f_argc, args, optr);
        } else {
                        for (i = 0; i < f->f_argc; i++) {
                args[i].ex_type = 0;
                args[i].ex_int = 0;
                        }
                eptr = ex_if(expr, eptr, optr, args, idx);
                }
        for (i = 0; i < f->f_argc; i++) {
                if (args[i].ex_type == ET_VEC)
                        fts_free(args[i].ex_vec);
        }
        return (eptr);
}